

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O1

String * __thiscall asl::String::operator=(String *this,wchar_t **x)

{
  undefined8 b;
  String s;
  String local_28;
  
  String(&local_28,*x);
  b = local_28.field_2._str;
  if (local_28._size == 0) {
    b = &local_28.field_2;
  }
  assign(this,(char *)b,local_28._len);
  if (local_28._size != 0) {
    ::free(local_28.field_2._str);
  }
  return this;
}

Assistant:

String& operator=(const T& x) { String s=x; *this = s; return *this; }